

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall
QPDFArgParser::addHelpTopic(QPDFArgParser *this,string *topic,string *short_text,string *long_text)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  element_type *peVar3;
  int iVar4;
  const_iterator cVar5;
  mapped_type *this_00;
  mapped_type *pmVar6;
  logic_error *plVar7;
  long *plVar8;
  size_type *psVar9;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = std::__cxx11::string::compare((char *)topic);
  if (iVar4 == 0) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "QPDFArgParser: can\'t register reserved help topic ",topic);
    std::logic_error::logic_error(plVar7,(string *)local_c0);
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((topic->_M_string_length != 0) && (*(topic->_M_dataplus)._M_p != '-')) {
    peVar3 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
            ::find(&(peVar3->help_topics)._M_t,topic);
    if (cVar5._M_node == &(peVar3->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header) {
      HelpTopic::HelpTopic((HelpTopic *)local_c0,short_text,long_text);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                ::operator[](&((this->m).
                               super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->help_topics,topic);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_c0);
      std::__cxx11::string::operator=((string *)&this_00->long_text,(string *)&local_a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this_00->options)._M_t);
      if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var1 = &local_80._M_impl.super__Rb_tree_header;
        (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_80._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_80._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_80._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_80._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &(this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header;
        (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_80._M_impl.super__Rb_tree_header._M_node_count;
        local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
      }
      pcVar2 = local_c0 + 0x10;
      if ((pointer)local_c0._0_8_ != pcVar2) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      peVar3 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_c0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"help","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
               ::operator[](&peVar3->help_option_table,(key_type *)local_c0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&pmVar6->choices,topic);
      if ((pointer)local_c0._0_8_ != pcVar2) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      return;
    }
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"QPDFArgParser: topic ",topic);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_c0._0_8_ = *plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_c0._0_8_ == psVar9) {
      local_c0._16_8_ = *psVar9;
      local_c0._24_8_ = plVar8[3];
      local_c0._0_8_ = local_c0 + 0x10;
    }
    else {
      local_c0._16_8_ = *psVar9;
    }
    local_c0._8_8_ = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::logic_error::logic_error(plVar7,(string *)local_c0);
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar7,"QPDFArgParser: help topics must not start with -");
  __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::addHelpTopic(
    std::string const& topic, std::string const& short_text, std::string const& long_text)
{
    if (topic == "all") {
        QTC::TC("libtests", "QPDFArgParser add reserved help topic");
        throw std::logic_error("QPDFArgParser: can't register reserved help topic " + topic);
    }
    if (!((topic.length() > 0) && (topic.at(0) != '-'))) {
        QTC::TC("libtests", "QPDFArgParser bad topic for help");
        throw std::logic_error("QPDFArgParser: help topics must not start with -");
    }
    if (m->help_topics.count(topic)) {
        QTC::TC("libtests", "QPDFArgParser add existing topic");
        throw std::logic_error("QPDFArgParser: topic " + topic + " has already been added");
    }

    m->help_topics[topic] = HelpTopic(short_text, long_text);
    m->help_option_table["help"].choices.insert(topic);
}